

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O2

void Cmd_vmengine(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  EVMEngine EStack_10;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 != 2) {
LAB_0036ecbd:
    Printf("Usage: vmengine <default|checked|unchecked>\n");
    return;
  }
  pcVar2 = FCommandLine::operator[](argv,1);
  iVar1 = strcasecmp(pcVar2,"default");
  if (iVar1 == 0) {
    EStack_10 = VMEngine_Default;
  }
  else {
    pcVar2 = FCommandLine::operator[](argv,1);
    iVar1 = strcasecmp(pcVar2,"checked");
    if (iVar1 == 0) {
      EStack_10 = VMEngine_Checked;
    }
    else {
      pcVar2 = FCommandLine::operator[](argv,1);
      iVar1 = strcasecmp(pcVar2,"unchecked");
      if (iVar1 != 0) goto LAB_0036ecbd;
      EStack_10 = VMEngine_Unchecked;
    }
  }
  VMSelectEngine(EStack_10);
  return;
}

Assistant:

CCMD(vmengine)
{
	if (argv.argc() == 2)
	{
		if (stricmp(argv[1], "default") == 0)
		{
			VMSelectEngine(VMEngine_Default);
			return;
		}
		else if (stricmp(argv[1], "checked") == 0)
		{
			VMSelectEngine(VMEngine_Checked);
			return;
		}
		else if (stricmp(argv[1], "unchecked") == 0)
		{
			VMSelectEngine(VMEngine_Unchecked);
			return;
		}
	}
	Printf("Usage: vmengine <default|checked|unchecked>\n");
}